

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_ArrayIo_Test::TestBody(IoTest_ArrayIo_Test *this)

{
  int block_size;
  int size;
  long lVar1;
  bool read_eof;
  ZeroCopyOutputStream *output_00;
  long lVar2;
  ArrayOutputStream output;
  uint8_t buffer [256];
  
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    block_size = (&io::(anonymous_namespace)::IoTest::kBlockSizes)[lVar1];
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 4) {
      output_00 = (ZeroCopyOutputStream *)buffer;
      ArrayOutputStream::ArrayOutputStream(&output,(ZeroCopyOutputStream *)buffer,0x100,block_size);
      size = IoTest::WriteStuff((IoTest *)&output,output_00);
      ArrayInputStream::ArrayInputStream
                ((ArrayInputStream *)&output,(ZeroCopyOutputStream *)buffer,size,
                 *(int *)((long)&io::(anonymous_namespace)::IoTest::kBlockSizes + lVar2));
      IoTest::ReadStuff((IoTest *)&output,(ZeroCopyInputStream *)0x1,read_eof);
    }
  }
  return;
}

Assistant:

TEST_F(IoTest, ArrayIo) {
  const int kBufferSize = 256;
  uint8_t buffer[kBufferSize];

  for (int i = 0; i < kBlockSizeCount; i++) {
    for (int j = 0; j < kBlockSizeCount; j++) {
      int size;
      {
        ArrayOutputStream output(buffer, kBufferSize, kBlockSizes[i]);
        size = WriteStuff(&output);
      }
      {
        ArrayInputStream input(buffer, size, kBlockSizes[j]);
        ReadStuff(&input);
      }
    }
  }
}